

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::accessChainPushSwizzle
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle,
          Id preSwizzleBaseType,CoherentFlags coherentFlags,uint alignment)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_4c;
  undefined1 local_48 [4];
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oldSwizzle;
  uint alignment_local;
  Id preSwizzleBaseType_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle_local;
  Builder *this_local;
  CoherentFlags coherentFlags_local;
  
  this_local._4_4_ = coherentFlags;
  oldSwizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       AccessChain::CoherentFlags::operator|=
                 (&(this->accessChain).coherentFlags,(CoherentFlags *)((long)&this_local + 4));
  (this->accessChain).alignment = alignment | (this->accessChain).alignment;
  if ((this->accessChain).preSwizzleBaseType == 0) {
    (this->accessChain).preSwizzleBaseType = preSwizzleBaseType;
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&(this->accessChain).swizzle);
  if (sVar2 == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&(this->accessChain).swizzle,swizzle);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
               &(this->accessChain).swizzle);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&(this->accessChain).swizzle,0)
    ;
    local_4c = 0;
    while( true ) {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(swizzle);
      if (sVar2 <= local_4c) break;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (swizzle,(ulong)local_4c);
      uVar1 = *pvVar3;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
      if (sVar2 <= uVar1) {
        __assert_fail("swizzle[i] < oldSwizzle.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xf7a,
                      "void spv::Builder::accessChainPushSwizzle(std::vector<unsigned int> &, Id, AccessChain::CoherentFlags, unsigned int)"
                     );
      }
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (swizzle,(ulong)local_4c);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                          (ulong)*pvVar3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&(this->accessChain).swizzle,pvVar3);
      local_4c = local_4c + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  }
  simplifyAccessChainSwizzle(this);
  return;
}

Assistant:

void Builder::accessChainPushSwizzle(std::vector<unsigned>& swizzle, Id preSwizzleBaseType,
    AccessChain::CoherentFlags coherentFlags, unsigned int alignment)
{
    accessChain.coherentFlags |= coherentFlags;
    accessChain.alignment |= alignment;

    // swizzles can be stacked in GLSL, but simplified to a single
    // one here; the base type doesn't change
    if (accessChain.preSwizzleBaseType == NoType)
        accessChain.preSwizzleBaseType = preSwizzleBaseType;

    // if needed, propagate the swizzle for the current access chain
    if (accessChain.swizzle.size() > 0) {
        std::vector<unsigned> oldSwizzle = accessChain.swizzle;
        accessChain.swizzle.resize(0);
        for (unsigned int i = 0; i < swizzle.size(); ++i) {
            assert(swizzle[i] < oldSwizzle.size());
            accessChain.swizzle.push_back(oldSwizzle[swizzle[i]]);
        }
    } else
        accessChain.swizzle = swizzle;

    // determine if we need to track this swizzle anymore
    simplifyAccessChainSwizzle();
}